

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  char *pcVar6;
  gzFile pgVar7;
  FILE *in;
  char **ppcVar8;
  char *__s1;
  bool bVar9;
  char outmode [20];
  undefined4 local_48;
  undefined1 local_44;
  
  local_44 = 0;
  local_48 = 0x20366277;
  pcVar1 = *argv;
  prog = pcVar1;
  pcVar6 = strrchr(pcVar1,0x2f);
  __s1 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    __s1 = pcVar1;
  }
  iVar4 = strcmp(__s1,"gunzip");
  if (iVar4 == 0) {
    bVar9 = true;
    bVar2 = false;
  }
  else {
    iVar4 = strcmp(__s1,"zcat");
    bVar9 = iVar4 == 0;
    bVar2 = bVar9;
  }
  ppcVar8 = argv + 1;
  iVar4 = argc + -1;
  if (argc < 2) {
LAB_00101936:
    local_48 = local_48 & 0xffffff;
  }
  else {
    cVar3 = ' ';
    do {
      pcVar1 = *ppcVar8;
      if (*pcVar1 != '-') goto LAB_00101932;
      if ((pcVar1[1] == 'c') && (pcVar1[2] == '\0')) {
        bVar2 = true;
      }
      else if ((pcVar1[1] == 'd') && (pcVar1[2] == '\0')) {
        bVar9 = true;
      }
      else if ((pcVar1[1] == 'f') && (pcVar1[2] == '\0')) {
        local_48 = CONCAT13(0x66,(undefined3)local_48);
        cVar3 = 'f';
      }
      else if ((pcVar1[1] == 'h') && (pcVar1[2] == '\0')) {
        local_48 = CONCAT13(0x68,(undefined3)local_48);
        cVar3 = 'h';
      }
      else if ((pcVar1[1] == 'r') && (pcVar1[2] == '\0')) {
        local_48 = CONCAT13(0x52,(undefined3)local_48);
        cVar3 = 'R';
      }
      else {
        if (8 < (byte)(pcVar1[1] - 0x31U)) goto LAB_00101932;
        if (pcVar1[2] != '\0') {
          iVar4 = argc + -1;
          goto LAB_00101932;
        }
        local_48._0_3_ = CONCAT12(pcVar1[1],(undefined2)local_48);
      }
      ppcVar8 = ppcVar8 + 1;
      iVar4 = iVar4 + -1;
      argc = argc + -1;
    } while (1 < argc);
    iVar4 = 0;
LAB_00101932:
    if (cVar3 == ' ') goto LAB_00101936;
  }
  if (iVar4 == 0) {
    if (bVar9) {
      iVar4 = fileno(_stdin);
      pgVar7 = (gzFile)gzdopen(iVar4,"rb");
      if (pgVar7 == (gzFile)0x0) {
LAB_00101a6e:
        main_cold_3();
LAB_00101a73:
        main_cold_4();
        return extraout_EAX;
      }
      gz_uncompress(pgVar7,(FILE *)_stdout);
    }
    else {
      iVar4 = fileno(_stdout);
      pgVar7 = (gzFile)gzdopen(iVar4,&local_48);
      if (pgVar7 == (gzFile)0x0) goto LAB_00101a73;
      gz_compress((FILE *)_stdin,pgVar7);
    }
  }
  else {
    do {
      pcVar1 = *ppcVar8;
      if (bVar9) {
        if (bVar2) {
          pgVar7 = (gzFile)gzopen(pcVar1,"rb");
          if (pgVar7 == (gzFile)0x0) {
            main_cold_1();
          }
          else {
            gz_uncompress(pgVar7,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar1);
        }
      }
      else if (bVar2) {
        in = fopen(pcVar1,"rb");
        if (in == (FILE *)0x0) {
          perror(*ppcVar8);
        }
        else {
          iVar5 = fileno(_stdout);
          pgVar7 = (gzFile)gzdopen(iVar5,&local_48);
          if (pgVar7 == (gzFile)0x0) {
            main_cold_2();
            goto LAB_00101a6e;
          }
          gz_compress((FILE *)in,pgVar7);
        }
      }
      else {
        file_compress(pcVar1,(char *)&local_48);
      }
      ppcVar8 = ppcVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    int copyout = 0;
    int uncompr = 0;
    gzFile file;
    char *bname, outmode[20];

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outmode, sizeof(outmode), "%s", "wb6 ");
#else
    strcpy(outmode, "wb6 ");
#endif

    prog = argv[0];
    bname = strrchr(argv[0], '/');
    if (bname)
      bname++;
    else
      bname = argv[0];
    argc--, argv++;

    if (!strcmp(bname, "gunzip"))
      uncompr = 1;
    else if (!strcmp(bname, "zcat"))
      copyout = uncompr = 1;

    while (argc > 0) {
      if (strcmp(*argv, "-c") == 0)
        copyout = 1;
      else if (strcmp(*argv, "-d") == 0)
        uncompr = 1;
      else if (strcmp(*argv, "-f") == 0)
        outmode[3] = 'f';
      else if (strcmp(*argv, "-h") == 0)
        outmode[3] = 'h';
      else if (strcmp(*argv, "-r") == 0)
        outmode[3] = 'R';
      else if ((*argv)[0] == '-' && (*argv)[1] >= '1' && (*argv)[1] <= '9' &&
               (*argv)[2] == 0)
        outmode[2] = (*argv)[1];
      else
        break;
      argc--, argv++;
    }
    if (outmode[3] == ' ')
        outmode[3] = 0;
    if (argc == 0) {
        SET_BINARY_MODE(stdin);
        SET_BINARY_MODE(stdout);
        if (uncompr) {
            file = gzdopen(fileno(stdin), "rb");
            if (file == NULL) error("can't gzdopen stdin");
            gz_uncompress(file, stdout);
        } else {
            file = gzdopen(fileno(stdout), outmode);
            if (file == NULL) error("can't gzdopen stdout");
            gz_compress(stdin, file);
        }
    } else {
        if (copyout) {
            SET_BINARY_MODE(stdout);
        }
        do {
            if (uncompr) {
                if (copyout) {
                    file = gzopen(*argv, "rb");
                    if (file == NULL)
                        fprintf(stderr, "%s: can't gzopen %s\n", prog, *argv);
                    else
                        gz_uncompress(file, stdout);
                } else {
                    file_uncompress(*argv);
                }
            } else {
                if (copyout) {
                    FILE * in = fopen(*argv, "rb");

                    if (in == NULL) {
                        perror(*argv);
                    } else {
                        file = gzdopen(fileno(stdout), outmode);
                        if (file == NULL) error("can't gzdopen stdout");

                        gz_compress(in, file);
                    }

                } else {
                    file_compress(*argv, outmode);
                }
            }
        } while (argv++, --argc);
    }
    return 0;
}